

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathNumberFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlNode *cur;
  xmlXPathContextPtr ctxt_00;
  xmlChar *str;
  xmlXPathObjectPtr pxVar1;
  xmlXPathObjectPtr value;
  int error;
  double dVar2;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueNr <= ctxt->valueFrame) {
      error = 0x17;
      goto LAB_001e0987;
    }
    pxVar1 = valuePop(ctxt);
    ctxt_00 = ctxt->context;
    if (pxVar1 == (xmlXPathObjectPtr)0x0) {
      value = xmlXPathCacheNewFloat(ctxt_00,0.0);
    }
    else {
      value = pxVar1;
      if (pxVar1->type != XPATH_NUMBER) {
        dVar2 = xmlXPathCastToNumber(pxVar1);
        value = xmlXPathCacheNewFloat(ctxt_00,dVar2);
        xmlXPathReleaseObject(ctxt_00,pxVar1);
      }
    }
  }
  else {
    if (nargs != 0) {
      error = 0xc;
LAB_001e0987:
      xmlXPathErr(ctxt,error);
      return;
    }
    cur = ctxt->context->node;
    if (cur != (xmlNode *)0x0) {
      str = xmlNodeGetContent(cur);
      dVar2 = xmlXPathStringEvalNumber(str);
      pxVar1 = xmlXPathCacheNewFloat(ctxt->context,dVar2);
      valuePush(ctxt,pxVar1);
      (*xmlFree)(str);
      return;
    }
    value = xmlXPathCacheNewFloat(ctxt->context,0.0);
  }
  valuePush(ctxt,value);
  return;
}

Assistant:

void
xmlXPathNumberFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;
    double res;

    if (ctxt == NULL) return;
    if (nargs == 0) {
	if (ctxt->context->node == NULL) {
	    valuePush(ctxt, xmlXPathCacheNewFloat(ctxt->context, 0.0));
	} else {
	    xmlChar* content = xmlNodeGetContent(ctxt->context->node);

	    res = xmlXPathStringEvalNumber(content);
	    valuePush(ctxt, xmlXPathCacheNewFloat(ctxt->context, res));
	    xmlFree(content);
	}
	return;
    }

    CHECK_ARITY(1);
    cur = valuePop(ctxt);
    valuePush(ctxt, xmlXPathCacheConvertNumber(ctxt->context, cur));
}